

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_FuncTableFree(TA_StringTable *table)

{
  void *in_RDI;
  TA_StringTablePriv *stringTablePriv;
  
  if (in_RDI != (void *)0x0) {
    if (*(int **)((long)in_RDI + 0x10) == (int *)0x0) {
      return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
    }
    if (**(int **)((long)in_RDI + 0x10) != -0x5df34df4) {
      return TA_BAD_OBJECT;
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return TA_SUCCESS;
}

Assistant:

TA_RetCode TA_FuncTableFree( TA_StringTable *table )
{
   TA_StringTablePriv *stringTablePriv;

   if( table )
   {
      stringTablePriv = (TA_StringTablePriv *)table->hiddenData;
      if( !stringTablePriv )
      {
         return TA_INTERNAL_ERROR(3);
      }

      if( stringTablePriv->magicNumber != TA_STRING_TABLE_FUNC_MAGIC_NB )
      {
         return TA_BAD_OBJECT;
      }

      if( table->string )
         TA_Free( (void *)table->string );

      TA_Free( table );
   }

   return TA_SUCCESS;
}